

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaDec.c
# Opt level: O2

SRes LzmaDec_AllocateProbs(CLzmaDec *p,Byte *props,uint propsSize,ISzAlloc *alloc)

{
  SRes SVar1;
  CLzmaProps propNew;
  CLzmaProps local_20;
  
  SVar1 = LzmaProps_Decode(&local_20,props,propsSize);
  if (SVar1 == 0) {
    SVar1 = LzmaDec_AllocateProbs2(p,&local_20,alloc);
    if (SVar1 == 0) {
      (p->prop).lc = local_20.lc;
      (p->prop).lp = local_20.lp;
      (p->prop).pb = local_20.pb;
      (p->prop).dicSize = local_20.dicSize;
      SVar1 = 0;
    }
  }
  return SVar1;
}

Assistant:

SRes LzmaDec_AllocateProbs(CLzmaDec *p, const Byte *props, unsigned propsSize, ISzAlloc *alloc)
{
  CLzmaProps propNew;
  RINOK(LzmaProps_Decode(&propNew, props, propsSize));
  RINOK(LzmaDec_AllocateProbs2(p, &propNew, alloc));
  p->prop = propNew;
  return SZ_OK;
}